

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw.cxx
# Opt level: O1

void fl_measure(char *str,int *w,int *h,int draw_symbols)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  char cVar7;
  int iVar8;
  bool bVar9;
  double dVar10;
  double width;
  char *linebuf;
  int buflen;
  double local_58;
  ulong local_50;
  ulong local_48;
  char *local_40;
  int local_34;
  
  if ((str == (char *)0x0) || (*str == '\0')) {
    *w = 0;
    *h = 0;
    return;
  }
  uVar2 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
  *h = uVar2;
  iVar8 = 0;
  local_40 = (char *)0x0;
  local_58 = 0.0;
  if (draw_symbols == 0) {
    local_48 = 0;
    local_50 = 0;
  }
  else {
    pcVar5 = str;
    if ((*str == '@') && (pcVar5 = str + (ulong)(str[1] == '@') * 2, str[1] != '@')) {
      cVar7 = *str;
      while ((cVar7 != '\0' && (iVar3 = isspace((int)cVar7), iVar3 == 0))) {
        cVar7 = str[1];
        str = str + 1;
      }
      iVar3 = isspace((int)cVar7);
      pcVar5 = str + (iVar3 != 0);
      local_50 = (ulong)uVar2;
      str = pcVar5;
    }
    else {
      local_50 = 0;
    }
    pcVar5 = strchr(pcVar5,0x40);
    if (pcVar5 == (char *)0x0) {
      local_48 = 0;
    }
    else {
      local_48 = (ulong)uVar2;
      if (pcVar5[1] == '@') {
        local_48 = 0;
      }
    }
  }
  iVar3 = (int)local_50;
  iVar4 = (int)local_48;
  iVar6 = 1;
  do {
    str = expand_text_(str,&local_40,0,(double)(*w - (iVar3 + iVar4)),&local_34,&local_58,
                       (uint)(*w != 0),draw_symbols);
    dVar10 = ceil(local_58);
    iVar1 = (int)dVar10;
    if ((int)dVar10 < iVar8) {
      iVar1 = iVar8;
    }
    iVar8 = iVar1;
    if (*str == '@') {
      if ((draw_symbols != 0) && (str[1] != '@')) {
LAB_001eac5d:
        iVar3 = (int)local_50;
        iVar4 = (int)local_48;
        if (iVar3 != 0 || iVar4 != 0) {
          bVar9 = iVar3 != 0;
          iVar3 = 0;
          if (bVar9) {
            iVar3 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar3 = iVar3 * iVar6;
          }
          if (iVar4 == 0) {
            iVar4 = 0;
          }
          else {
            iVar4 = (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x3a])();
            iVar4 = iVar4 * iVar6;
          }
        }
        *w = iVar4 + iVar3 + iVar8;
        *h = iVar6 * *h;
        return;
      }
    }
    else if (*str == '\0') goto LAB_001eac5d;
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

void fl_measure(const char* str, int& w, int& h, int draw_symbols) {
  if (!str || !*str) {w = 0; h = 0; return;}
  h = fl_height();
  char *linebuf = NULL;
  const char* p;
  const char* e;
  int buflen;
  int lines;
  double width=0;
  int W = 0;
  int symwidth[2], symtotal;

  symwidth[0] = 0;	// size of symbol at beginning of string (if any)
  symwidth[1] = 0;	// size of symbol at end of string (if any)

  if (draw_symbols) {
    // Symbol at beginning of string?
    const char *sym2 = (str[0]=='@' && str[1]=='@') ? str+2 : str;	// sym2 check will skip leading @@
    if (str[0] == '@' && str[1] != '@') {
      while (*str && !isspace(*str)) { ++str; }		// skip over symbol
      if (isspace(*str)) ++str;				// skip over trailing space
      sym2 = str;					// sym2 check will skip leading symbol
      symwidth[0] = h;
    }
    // Symbol at end of string?
    if ((p=strchr(sym2,'@')) != NULL && p[1] != '@') {
      symwidth[1] = h;
    }
  }

  symtotal = symwidth[0] + symwidth[1];

  for (p = str, lines=0; p;) {
//    e = expand(p, linebuf, w - symtotal, buflen, width, w != 0, draw_symbols);
    e = expand_text_(p, linebuf, 0, w - symtotal, buflen, width,
			w != 0, draw_symbols);
    if ((int)ceil(width) > W) W = (int)ceil(width);
    lines++;
    if (!*e || (*e == '@' && e[1] != '@' && draw_symbols)) break;
    p = e;
  }

  if ((symwidth[0] || symwidth[1]) && lines) {
    if (symwidth[0]) symwidth[0] = lines * fl_height();
    if (symwidth[1]) symwidth[1] = lines * fl_height();
  }

  symtotal = symwidth[0] + symwidth[1];

  w = W + symtotal;
  h = lines*h;
}